

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall network::Network::setPort(Network *this,unsigned_short port)

{
  service_type *psVar1;
  bool bVar2;
  time_t __val;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  op;
  wait_op *op_00;
  runtime_error *this_00;
  io_service service;
  function<void_(const_boost::system::error_code_&,_unsigned_long)> onRead;
  mutable_buffers_1 local_5b8;
  string res;
  deadline_timer stopTimer;
  string testQuery;
  socket sock;
  deadline_timer queryTimer;
  char buf [1024];
  
  boost::asio::io_context::io_context(&service);
  this->port_ = port;
  __val = time((time_t *)0x0);
  std::__cxx11::to_string(&testQuery,__val);
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  memset(buf,0,0x400);
  stopTimer.impl_.service_ = (service_type *)0x186a0;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&queryTimer,&service,(duration_type *)&stopTimer,(type *)0x0);
  stopTimer.impl_.service_ = (service_type *)&sock;
  sock.
  super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.service_ = (service_type *)this;
  sock.
  super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.super_base_implementation_type._0_8_ = &testQuery;
  op.time_.time_count_.value_ = (time_rep_type)boost::asio::asio_handler_allocate(0x68);
  *(undefined8 *)op.time_.time_count_.value_ = 0;
  *(code **)((long)op.time_.time_count_.value_ + 8) =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  *(uint *)((long)op.time_.time_count_.value_ + 0x10) = 0;
  ((error_code *)((long)op.time_.time_count_.value_ + 0x18))->val_ = 0;
  *(bool *)((long)op.time_.time_count_.value_ + 0x1c) = false;
  *(undefined1 **)((long)op.time_.time_count_.value_ + 0x20) =
       boost::system::detail::cat_holder<void>::system_category_instance;
  (((wait_op *)((long)op.time_.time_count_.value_ + 0x28))->super_operation).next_ =
       (scheduler_operation *)
       sock.
       super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       .impl_.service_;
  *(undefined8 *)((long)op.time_.time_count_.value_ + 0x30) =
       sock.
       super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       .impl_.implementation_.super_base_implementation_type._0_8_;
  stopTimer.impl_.implementation_.expiry.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
          )op.time_.time_count_.value_;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)((long)op.time_.time_count_.value_ + 0x38),&queryTimer.impl_.executor_);
  queryTimer.impl_.implementation_.might_have_pending_waits = true;
  stopTimer.impl_.implementation_._8_8_ = op.time_.time_count_.value_;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            ((queryTimer.impl_.service_)->scheduler_,&(queryTimer.impl_.service_)->timer_queue_,
             &queryTimer.impl_.implementation_.expiry,&queryTimer.impl_.implementation_.timer_data,
             (wait_op *)op.time_.time_count_.value_);
  stopTimer.impl_.implementation_.expiry.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(time_rep_type)0x0;
  stopTimer.impl_.implementation_.might_have_pending_waits = false;
  stopTimer.impl_.implementation_._9_7_ = 0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:108:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr((ptr *)&stopTimer);
  stopTimer.impl_.implementation_.timer_data.op_queue_.front_._0_4_ = 0;
  stopTimer.impl_.implementation_.expiry.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
        )(time_rep_type)0x0;
  stopTimer.impl_.implementation_.might_have_pending_waits = false;
  stopTimer.impl_.implementation_._9_7_ = 0;
  stopTimer.impl_.service_ =
       (service_type *)CONCAT44(0,CONCAT22(this->port_ << 8 | this->port_ >> 8,2));
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&sock,&service,(endpoint_type *)&stopTimer,(type *)0x0);
  onRead.super__Function_base._M_functor._M_unused._M_object = (void *)0x30d40;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_deadline_timer<boost::asio::io_context>
            (&stopTimer,&service,(duration_type *)&onRead,(type *)0x0);
  psVar1 = stopTimer.impl_.service_;
  onRead.super__Function_base._M_functor._M_unused._M_object = &local_5b8;
  local_5b8.super_mutable_buffer.data_ = (scheduler_operation *)&service;
  op_00 = (wait_op *)boost::asio::asio_handler_allocate(0x60);
  (op_00->super_operation).next_ = (scheduler_operation *)0x0;
  (op_00->super_operation).func_ =
       boost::asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op_00->super_operation).task_result_ = 0;
  (op_00->ec_).val_ = 0;
  (op_00->ec_).failed_ = false;
  (op_00->ec_).cat_ =
       (error_category *)boost::system::detail::cat_holder<void>::system_category_instance;
  op_00[1].super_operation.next_ = (scheduler_operation *)local_5b8.super_mutable_buffer.data_;
  onRead.super__Function_base._M_functor._8_8_ = op_00;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base((handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                       *)&op_00[1].super_operation.func_,&stopTimer.impl_.executor_);
  stopTimer.impl_.implementation_.might_have_pending_waits = true;
  onRead.super__Function_base._M_manager = (_Manager_type)op_00;
  boost::asio::detail::epoll_reactor::
  schedule_timer<boost::asio::time_traits<boost::posix_time::ptime>>
            (psVar1->scheduler_,&psVar1->timer_queue_,&stopTimer.impl_.implementation_.expiry,
             &stopTimer.impl_.implementation_.timer_data,op_00);
  onRead.super__Function_base._M_functor._8_8_ = 0;
  onRead.super__Function_base._M_manager = (_Manager_type)0x0;
  boost::asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:115:3),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr((ptr *)&onRead);
  onRead.super__Function_base._M_manager = (_Manager_type)0x0;
  onRead._M_invoker = (_Invoker_type)0x0;
  onRead.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  onRead.super__Function_base._M_functor._8_8_ = 0;
  onRead.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(string **)onRead.super__Function_base._M_functor._M_unused._0_8_ = &res;
  *(char **)((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 8) = buf;
  *(basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    **)((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       (basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
        *)&sock;
  *(function<void_(const_boost::system::error_code_&,_unsigned_long)> **)
   ((long)onRead.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = &onRead;
  onRead._M_invoker =
       std::
       _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
       ::_M_invoke;
  onRead.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_boost::system::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/network/network.cpp:118:3)>
       ::_M_manager;
  local_5b8.super_mutable_buffer.size_ = 0x400;
  local_5b8.super_mutable_buffer.data_ = buf;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_receive<boost::asio::mutable_buffers_1,std::function<void(boost::system::error_code_const&,unsigned_long)>&>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&sock,&local_5b8,&onRead);
  boost::asio::io_context::run(&service);
  bVar2 = std::operator!=(&testQuery,&res);
  if (!bVar2) {
    std::_Function_base::~_Function_base(&onRead.super__Function_base);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&stopTimer.impl_);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)&sock);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&queryTimer.impl_);
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)&testQuery);
    boost::asio::execution_context::~execution_context(&service.super_execution_context);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Access denied");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Network::setPort(const unsigned short port)
{
	boost::asio::io_service service;
	port_ = port;
	std::string testQuery = std::to_string(time(0));
	std::string res;
	char buf[PACKAGE_SIZE];
	memset(buf, 0, PACKAGE_SIZE);

	// Timer waits receiver start
	boost::asio::deadline_timer queryTimer(service, boost::posix_time::milliseconds(100));
	queryTimer.async_wait(
		[&](const boost::system::error_code &ex) { sendBroadcast(testQuery); }
	);
	
	// Receive test query
	udp::socket sock(service, udp::endpoint(udp::v4(), port_));
	boost::asio::deadline_timer stopTimer(service, boost::posix_time::milliseconds(200));
	stopTimer.async_wait(
		[&service](const boost::system::error_code &ex) { service.stop(); }
	);
	std::function<void(const boost::system::error_code&, std::size_t)> onRead =
		[&](const boost::system::error_code &err, std::size_t read_bytes)
	{
		res = buf;
		memset(buf, 0, PACKAGE_SIZE);
		sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	};
	sock.async_receive(boost::asio::buffer(buf, PACKAGE_SIZE), onRead);
	service.run();

	if (testQuery != res)
		throw std::runtime_error("Access denied");
}